

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DEndGameMenu::HandleResult(DEndGameMenu *this,bool res)

{
  bool res_local;
  DEndGameMenu *this_local;
  
  if (res) {
    M_ClearMenus();
    if ((netgame & 1U) == 0) {
      D_StartTitle();
    }
  }
  else {
    (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
    DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
  }
  return;
}

Assistant:

void DEndGameMenu::HandleResult(bool res)
{
	if (res)
	{
		M_ClearMenus ();
		if (!netgame)
		{
			D_StartTitle ();
		}
	}
	else
	{
		Close();
		CloseSound();
	}
}